

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::removeNamedItem(QDomNamedNodeMapPrivate *this,QString *name)

{
  int iVar1;
  QDomNodePrivate *pQVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->readonly == false) {
    pQVar2 = namedItem(this,name);
    if (pQVar2 == (QDomNodePrivate *)0x0) goto LAB_0010fad3;
    if (this->appendToParent == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        iVar1 = (*this->parent->_vptr_QDomNodePrivate[6])(this->parent,pQVar2);
        return (QDomNodePrivate *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_0010fb34;
    }
    local_38.d = (pQVar2->name).d.d;
    local_38.ptr = (pQVar2->name).d.ptr;
    local_38.size = (pQVar2->name).d.size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,_QDomNodePrivate_*>::removeImpl<QString>(&this->map,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    LOCK();
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  else {
LAB_0010fad3:
    pQVar2 = (QDomNodePrivate *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar2;
  }
LAB_0010fb34:
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::removeNamedItem(const QString& name)
{
    if (readonly)
        return nullptr;

    QDomNodePrivate* p = namedItem(name);
    if (p == nullptr)
        return nullptr;
    if (appendToParent)
        return parent->removeChild(p);

    map.remove(p->nodeName());
    // We took a reference, so we have to free one here
    p->ref.deref();
    return p;
}